

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall SQCompilation::CheckerVisitor::checkCanReturnNull(CheckerVisitor *this,BinExpr *bin)

{
  TreeOp TVar1;
  bool bVar2;
  Expr *pEVar3;
  Node *n;
  Node *pNVar4;
  FunctionInfo *pFVar5;
  SQChar **ppSVar6;
  SQChar *n_00;
  bool isCtor;
  int32_t dummy;
  int32_t dummy_1;
  bool local_31;
  int32_t local_30 [2];
  
  if (this->effectsOnly != false) {
    return;
  }
  TVar1 = (bin->super_Expr).super_Node._op;
  if (((0x30 < (ulong)TVar1) || ((0x1f7f800000000U >> ((ulong)TVar1 & 0x3f) & 1) == 0)) &&
     (4 < TVar1 - TO_3CMP)) {
    return;
  }
  pEVar3 = skipUnary(bin->_lhs);
  local_30[0] = -1;
  pEVar3 = maybeEval(this,pEVar3,local_30,false);
  n = &skipUnary(pEVar3)->super_Node;
  pEVar3 = skipUnary(bin->_rhs);
  local_30[1] = 0xffffffff;
  pEVar3 = maybeEval(this,pEVar3,local_30 + 1,false);
  if (n->_op != TO_CALL) {
    pNVar4 = &skipUnary(pEVar3)->super_Node;
    n = (Node *)0x0;
    if (pNVar4->_op == TO_CALL) {
      n = pNVar4;
    }
  }
  if (n == (Node *)0x0) {
    return;
  }
  pEVar3 = (Expr *)n[1].super_ArenaObj._vptr_ArenaObj;
  local_31 = false;
  pFVar5 = findFunctionInfo(this,pEVar3,&local_31);
  if (local_31 != false) {
    return;
  }
  if (pFVar5 == (FunctionInfo *)0x0) {
    TVar1 = (pEVar3->super_Node)._op;
    if (TVar1 == TO_GETFIELD) {
      ppSVar6 = (SQChar **)&pEVar3[1].super_Node._coordinates.lineEnd;
    }
    else {
      if (TVar1 != TO_ID) {
        n_00 = (SQChar *)0x0;
        goto LAB_001525f2;
      }
      ppSVar6 = (SQChar **)(pEVar3 + 1);
    }
  }
  else {
    ppSVar6 = &pFVar5->declaration->_name;
  }
  n_00 = *ppSVar6;
LAB_001525f2:
  if ((n_00 != (SQChar *)0x0) && (bVar2 = canFunctionReturnNull(n_00), bVar2)) {
    report(this,n,0x5e,n_00);
  }
  return;
}

Assistant:

void CheckerVisitor::checkCanReturnNull(const BinExpr *bin) {
  if (effectsOnly)
    return;


  if (!isPureArithOperator(bin->op()) && !isRelationOperator(bin->op())) {
    return;
  }

  const Expr *l = skipUnary(maybeEval(skipUnary(bin->lhs())));
  const Expr *r = skipUnary(maybeEval(skipUnary(bin->rhs())));
  const CallExpr *c = nullptr;

  if (l->op() == TO_CALL) // -V522
    c = static_cast<const CallExpr *>(l);
  else if (r->op() == TO_CALL) // -V522
    c = static_cast<const CallExpr *>(r);

  if (!c)
    return;

  const Expr *callee = c->callee();
  bool isCtor = false;
  const FunctionInfo *info = findFunctionInfo(callee, isCtor);

  if (isCtor)
    return;

  const SQChar *funcName = nullptr;

  if (info) {
    funcName = info->declaration->name();
  }
  else if (callee->op() == TO_ID) {
    funcName = callee->asId()->id();
  }
  else if (callee->op() == TO_GETFIELD) {
    funcName = callee->asGetField()->fieldName();
  }

  if (funcName) {
    if (canFunctionReturnNull(funcName)) {
      report(c, DiagnosticsId::DI_FUNC_CAN_RET_NULL, funcName);
    }
  }
}